

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkBeamIGAslider.cpp
# Opt level: O1

void __thiscall chrono::fea::ChLinkBeamIGAslider::ChLinkBeamIGAslider(ChLinkBeamIGAslider *this)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [64];
  
  ChObj::ChObj((ChObj *)this);
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  *(undefined1 (*) [32])
   ((long)&(this->super_ChLinkBase).super_ChPhysicsItem.cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = auVar1;
  (this->super_ChLinkBase).super_ChPhysicsItem.system = (ChSystem *)auVar1._0_8_;
  (this->super_ChLinkBase).super_ChPhysicsItem.vis_model_instance =
       (shared_ptr<chrono::ChVisualModelInstance>)auVar1._8_16_;
  (this->super_ChLinkBase).super_ChPhysicsItem.cameras.
  super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar1._24_8_;
  *(undefined2 *)&(this->super_ChLinkBase).super_ChPhysicsItem.field_0x74 = 0x100;
  (this->super_ChLinkBase).super_ChPhysicsItem.field_0x76 = 0;
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLinkBeamIGAslider_00b51298;
  (this->m_react).m_data[0] = VNULL;
  (this->m_react).m_data[1] = DAT_00b90ac0;
  (this->m_react).m_data[2] = DAT_00b90ac8;
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->constraint2).super_ChConstraint.c_i = (double)auVar1._0_8_;
  (this->constraint2).super_ChConstraint.l_i = (double)auVar1._8_8_;
  (this->constraint2).super_ChConstraint.b_i = (double)auVar1._16_8_;
  (this->constraint2).super_ChConstraint.cfm_i = (double)auVar1._24_8_;
  (this->constraint2).super_ChConstraint.valid = false;
  (this->constraint2).super_ChConstraint.disabled = false;
  (this->constraint2).super_ChConstraint.redundant = false;
  (this->constraint2).super_ChConstraint.broken = false;
  (this->constraint2).super_ChConstraint.active = true;
  (this->constraint2).super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->constraint2).super_ChConstraint.g_i = 0.0;
  (this->constraint2).super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintNgeneric_00b63380;
  auVar2 = ZEXT864(0) << 0x20;
  (this->constraint2).variables =
       (vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>)auVar2._0_24_;
  (this->constraint2).Cq =
       (vector<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_std::allocator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
        )auVar2._24_24_;
  (this->constraint2).Eq.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar2._48_8_;
  (this->constraint2).Eq.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar2._56_8_;
  (this->constraint2).Eq.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->constraint3).super_ChConstraint.c_i = (double)auVar1._0_8_;
  (this->constraint3).super_ChConstraint.l_i = (double)auVar1._8_8_;
  (this->constraint3).super_ChConstraint.b_i = (double)auVar1._16_8_;
  (this->constraint3).super_ChConstraint.cfm_i = (double)auVar1._24_8_;
  (this->constraint3).super_ChConstraint.valid = false;
  (this->constraint3).super_ChConstraint.disabled = false;
  (this->constraint3).super_ChConstraint.redundant = false;
  (this->constraint3).super_ChConstraint.broken = false;
  (this->constraint3).super_ChConstraint.active = true;
  (this->constraint3).super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->constraint3).super_ChConstraint.g_i = 0.0;
  (this->constraint3).super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintNgeneric_00b63380;
  (this->m_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [64])
   &(this->constraint3).Eq.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar2;
  (this->constraint3).variables =
       (vector<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>)auVar2._0_24_;
  (this->constraint3).Cq =
       (vector<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_std::allocator<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
        )auVar2._24_24_;
  (this->constraint3).Eq.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar2._48_8_;
  (this->constraint3).Eq.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar2._56_8_;
  (this->m_csys).pos.m_data[0] = CSYSNORM;
  (this->m_csys).pos.m_data[1] = DAT_00b90b60;
  (this->m_csys).pos.m_data[2] = DAT_00b90b68;
  (this->m_csys).rot.m_data[0] = DAT_00b90b70;
  (this->m_csys).rot.m_data[1] = DAT_00b90b78;
  (this->m_csys).rot.m_data[2] = DAT_00b90b80;
  (this->m_csys).rot.m_data[3] = DAT_00b90b88;
  return;
}

Assistant:

ChLinkBeamIGAslider::ChLinkBeamIGAslider() : m_react(VNULL), m_csys(CSYSNORM) {}